

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
          (RepeatedPtrFieldBase *this,void *obj)

{
  int iVar1;
  Rep *pRVar2;
  
  if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size == this->total_size_)) {
    InternalExtend(this,1);
  }
  pRVar2 = this->rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = obj;
  return obj;
}

Assistant:

void* RepeatedPtrFieldBase::AddOutOfLineHelper(void* obj) {
  if (!rep_ || rep_->allocated_size == total_size_) {
    InternalExtend(1);  // Equivalent to "Reserve(total_size_ + 1)"
  }
  ++rep_->allocated_size;
  rep_->elements[current_size_++] = obj;
  return obj;
}